

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

HighsStatus highsStatusFromHighsModelStatus(HighsModelStatus model_status)

{
  HighsModelStatus model_status_local;
  HighsStatus local_4;
  
  switch(model_status) {
  case kMin:
    local_4 = kError;
    break;
  case kLoadError:
    local_4 = kError;
    break;
  case kModelError:
    local_4 = kError;
    break;
  case kPresolveError:
    local_4 = kError;
    break;
  case kSolveError:
    local_4 = kError;
    break;
  case kPostsolveError:
    local_4 = kError;
    break;
  case kModelEmpty:
    local_4 = kOk;
    break;
  case kOptimal:
    local_4 = kOk;
    break;
  case kInfeasible:
    local_4 = kOk;
    break;
  case kUnboundedOrInfeasible:
    local_4 = kOk;
    break;
  case kUnbounded:
    local_4 = kOk;
    break;
  case kObjectiveBound:
    local_4 = kOk;
    break;
  case kObjectiveTarget:
    local_4 = kOk;
    break;
  case kTimeLimit:
    local_4 = kWarning;
    break;
  case kIterationLimit:
    local_4 = kWarning;
    break;
  case kUnknown:
    local_4 = kWarning;
    break;
  case kSolutionLimit:
    local_4 = kWarning;
    break;
  case kInterrupt:
    local_4 = kWarning;
    break;
  case kMax:
    local_4 = kError;
    break;
  default:
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus highsStatusFromHighsModelStatus(HighsModelStatus model_status) {
  switch (model_status) {
    case HighsModelStatus::kNotset:
      return HighsStatus::kError;
    case HighsModelStatus::kLoadError:
      return HighsStatus::kError;
    case HighsModelStatus::kModelError:
      return HighsStatus::kError;
    case HighsModelStatus::kPresolveError:
      return HighsStatus::kError;
    case HighsModelStatus::kSolveError:
      return HighsStatus::kError;
    case HighsModelStatus::kPostsolveError:
      return HighsStatus::kError;
    case HighsModelStatus::kMemoryLimit:
      return HighsStatus::kError;
    case HighsModelStatus::kModelEmpty:
      return HighsStatus::kOk;
    case HighsModelStatus::kOptimal:
      return HighsStatus::kOk;
    case HighsModelStatus::kInfeasible:
      return HighsStatus::kOk;
    case HighsModelStatus::kUnboundedOrInfeasible:
      return HighsStatus::kOk;
    case HighsModelStatus::kUnbounded:
      return HighsStatus::kOk;
    case HighsModelStatus::kObjectiveBound:
      return HighsStatus::kOk;
    case HighsModelStatus::kObjectiveTarget:
      return HighsStatus::kOk;
    case HighsModelStatus::kTimeLimit:
      return HighsStatus::kWarning;
    case HighsModelStatus::kIterationLimit:
      return HighsStatus::kWarning;
    case HighsModelStatus::kSolutionLimit:
      return HighsStatus::kWarning;
    case HighsModelStatus::kInterrupt:
      return HighsStatus::kWarning;
    case HighsModelStatus::kUnknown:
      return HighsStatus::kWarning;
    default:
      return HighsStatus::kError;
  }
}